

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *p_manager)

{
  opj_image_comp_t *poVar1;
  opj_jp2_cmap_comp_t *poVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  opj_jp2_pclr_t *poVar6;
  OPJ_BYTE *pOVar7;
  OPJ_UINT32 *pOVar8;
  OPJ_BYTE *pOVar9;
  opj_jp2_cmap_comp_t *poVar10;
  opj_image_comp_t *ptr;
  OPJ_INT32 *pOVar11;
  OPJ_INT32 *pOVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  OPJ_UINT32 OVar23;
  opj_image_comp_t *ptr_00;
  void *pvVar24;
  long lVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  ushort uVar31;
  uint uVar32;
  ulong uVar33;
  ushort local_64;
  
  poVar6 = color->jp2_pclr;
  pOVar7 = poVar6->channel_size;
  pOVar8 = poVar6->entries;
  pOVar9 = poVar6->channel_sign;
  poVar10 = poVar6->cmap;
  bVar3 = poVar6->nr_channels;
  uVar32 = (uint)bVar3;
  lVar25 = 0;
  while ((ushort)lVar25 < (ushort)bVar3) {
    poVar2 = poVar10 + lVar25;
    lVar25 = lVar25 + 1;
    if (image->comps[poVar2->cmp].data == (OPJ_INT32 *)0x0) {
      opj_event_msg(p_manager,1,"image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n",
                    (ulong)((int)lVar25 - 1));
      return 0;
    }
  }
  ptr = image->comps;
  ptr_00 = (opj_image_comp_t *)opj_malloc((ulong)bVar3 << 6);
  if (ptr_00 != (opj_image_comp_t *)0x0) {
    lVar25 = 0x30;
    uVar33 = 0;
    while( true ) {
      if (uVar32 == uVar33) {
        uVar31 = color->jp2_pclr->nr_entries;
        uVar29 = 0;
        do {
          local_64 = (ushort)bVar3;
          if (local_64 <= (ushort)uVar29) {
            uVar29 = image->numcomps;
            for (uVar31 = 0; uVar31 < uVar29; uVar31 = uVar31 + 1) {
              if (ptr[uVar31].data != (OPJ_INT32 *)0x0) {
                opj_image_data_free(ptr[uVar31].data);
              }
            }
            opj_free(ptr);
            image->comps = ptr_00;
            image->numcomps = uVar32;
            return 1;
          }
          uVar28 = uVar29 & 0xffff;
          pOVar11 = ptr[poVar10[uVar28].cmp].data;
          if (pOVar11 == (OPJ_INT32 *)0x0) {
            __assert_fail("src",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                          ,0x450,
                          "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                         );
          }
          bVar4 = poVar10[uVar28].pcol;
          uVar33 = (ulong)(ptr_00[bVar4].h * ptr_00[bVar4].w);
          if (poVar10[uVar28].mtyp == '\0') {
            lVar25 = *(long *)((long)&ptr_00->data + (ulong)(uVar28 << 6));
            if (lVar25 == 0) {
              __assert_fail("dst",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                            ,0x456,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
            for (uVar30 = 0; uVar33 != uVar30; uVar30 = uVar30 + 1) {
              *(OPJ_INT32 *)(lVar25 + uVar30 * 4) = pOVar11[uVar30];
            }
          }
          else {
            if ((ushort)uVar29 != (ushort)bVar4) {
              __assert_fail("i == pcol",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                            ,0x45b,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
            pOVar12 = ptr_00[bVar4].data;
            if (pOVar12 == (OPJ_INT32 *)0x0) {
              __assert_fail("dst",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                            ,0x45d,
                            "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                           );
            }
            for (uVar30 = 0; uVar33 != uVar30; uVar30 = uVar30 + 1) {
              iVar5 = pOVar11[uVar30];
              iVar27 = uVar31 - 1;
              if (iVar5 < (int)(uint)uVar31) {
                iVar27 = iVar5;
              }
              if (iVar5 < 0) {
                iVar27 = 0;
              }
              pOVar12[uVar30] = pOVar8[(int)(iVar27 * uVar32 + uVar28)];
            }
          }
          uVar29 = uVar28 + 1;
        } while( true );
      }
      uVar30 = (ulong)poVar10[uVar33].pcol;
      uVar31 = poVar10[uVar33].cmp;
      if (poVar10[uVar33].mtyp == '\0') {
        uVar26 = uVar33;
        if (uVar30 != 0) {
          __assert_fail("pcol == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                        ,0x431,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
      }
      else {
        uVar26 = uVar30;
        if (uVar33 != uVar30) {
          __assert_fail("i == pcol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                        ,0x434,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
      }
      poVar1 = ptr + uVar31;
      OVar20 = poVar1->dx;
      OVar21 = poVar1->dy;
      OVar22 = poVar1->w;
      OVar23 = poVar1->h;
      poVar1 = ptr + uVar31;
      OVar18 = poVar1->x0;
      OVar19 = poVar1->y0;
      uVar13 = *(undefined8 *)(&poVar1->x0 + 2);
      poVar1 = ptr + uVar31;
      OVar16 = poVar1->sgnd;
      OVar17 = poVar1->resno_decoded;
      uVar14 = *(undefined8 *)(&poVar1->sgnd + 2);
      uVar15 = (&ptr[uVar31].data)[1];
      ptr_00[uVar26].data = ptr[uVar31].data;
      (&ptr_00[uVar26].data)[1] = (OPJ_INT32 *)uVar15;
      poVar1 = ptr_00 + uVar26;
      poVar1->sgnd = OVar16;
      poVar1->resno_decoded = OVar17;
      *(undefined8 *)(&poVar1->sgnd + 2) = uVar14;
      poVar1 = ptr_00 + uVar26;
      poVar1->x0 = OVar18;
      poVar1->y0 = OVar19;
      *(undefined8 *)(&poVar1->x0 + 2) = uVar13;
      poVar1 = ptr_00 + uVar26;
      poVar1->dx = OVar20;
      poVar1->dy = OVar21;
      poVar1->w = OVar22;
      poVar1->h = OVar23;
      pvVar24 = opj_image_data_alloc((ulong)ptr[uVar31].h * (ulong)ptr[uVar31].w * 4);
      *(void **)((long)&ptr_00->dx + lVar25) = pvVar24;
      if (pvVar24 == (void *)0x0) break;
      *(uint *)((long)ptr_00 + lVar25 + -0x18) = (uint)pOVar7[uVar33];
      *(uint *)((long)ptr_00 + lVar25 + -0x10) = (uint)pOVar9[uVar33];
      uVar33 = uVar33 + 1;
      lVar25 = lVar25 + 0x40;
    }
    for (lVar25 = lVar25 + -0x30; lVar25 != 0; lVar25 = lVar25 + -0x40) {
      opj_image_data_free(*(void **)((long)ptr_00 + lVar25 + -0x10));
    }
    opj_free(ptr_00);
  }
  opj_event_msg(p_manager,1,"Memory allocation failure in opj_jp2_apply_pclr().\n");
  return 0;
}

Assistant:

static OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,
                                   opj_jp2_color_t *color,
                                   opj_event_mgr_t * p_manager)
{
    opj_image_comp_t *old_comps, *new_comps;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    opj_jp2_cmap_comp_t *cmap;
    OPJ_INT32 *src, *dst;
    OPJ_UINT32 j, max;
    OPJ_UINT16 i, nr_channels, cmp, pcol;
    OPJ_INT32 k, top_k;

    channel_size = color->jp2_pclr->channel_size;
    channel_sign = color->jp2_pclr->channel_sign;
    entries = color->jp2_pclr->entries;
    cmap = color->jp2_pclr->cmap;
    nr_channels = color->jp2_pclr->nr_channels;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        if (image->comps[cmp].data == NULL) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n", i);
            return OPJ_FALSE;
        }
    }

    old_comps = image->comps;
    new_comps = (opj_image_comp_t*)
                opj_malloc(nr_channels * sizeof(opj_image_comp_t));
    if (!new_comps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Memory allocation failure in opj_jp2_apply_pclr().\n");
        return OPJ_FALSE;
    }
    for (i = 0; i < nr_channels; ++i) {
        pcol = cmap[i].pcol;
        cmp = cmap[i].cmp;

        /* Direct use */
        if (cmap[i].mtyp == 0) {
            assert(pcol == 0);
            new_comps[i] = old_comps[cmp];
        } else {
            assert(i == pcol);
            new_comps[pcol] = old_comps[cmp];
        }

        /* Palette mapping: */
        new_comps[i].data = (OPJ_INT32*)
                            opj_image_data_alloc(sizeof(OPJ_INT32) * old_comps[cmp].w * old_comps[cmp].h);
        if (!new_comps[i].data) {
            while (i > 0) {
                -- i;
                opj_image_data_free(new_comps[i].data);
            }
            opj_free(new_comps);
            opj_event_msg(p_manager, EVT_ERROR,
                          "Memory allocation failure in opj_jp2_apply_pclr().\n");
            return OPJ_FALSE;
        }
        new_comps[i].prec = channel_size[i];
        new_comps[i].sgnd = channel_sign[i];
    }

    top_k = color->jp2_pclr->nr_entries - 1;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        pcol = cmap[i].pcol;
        src = old_comps[cmp].data;
        assert(src); /* verified above */
        max = new_comps[pcol].w * new_comps[pcol].h;

        /* Direct use: */
        if (cmap[i].mtyp == 0) {
            dst = new_comps[i].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                dst[j] = src[j];
            }
        } else {
            assert(i == pcol);
            dst = new_comps[pcol].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                /* The index */
                if ((k = src[j]) < 0) {
                    k = 0;
                } else if (k > top_k) {
                    k = top_k;
                }

                /* The colour */
                dst[j] = (OPJ_INT32)entries[k * nr_channels + pcol];
            }
        }
    }

    max = image->numcomps;
    for (i = 0; i < max; ++i) {
        if (old_comps[i].data) {
            opj_image_data_free(old_comps[i].data);
        }
    }

    opj_free(old_comps);
    image->comps = new_comps;
    image->numcomps = nr_channels;

    return OPJ_TRUE;
}